

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemUtils.cpp
# Opt level: O2

void ApprovalTests::SystemUtils::makeDirectoryForNonWindows(string *directory)

{
  int iVar1;
  runtime_error *this;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string helpMessage;
  
  iVar1 = mkdir((directory->_M_dataplus)._M_p,0x1db);
  if (iVar1 == 0) {
    return;
  }
  ::std::__cxx11::string::string((string *)&local_50,"Unable to create directory: ",&local_51);
  ::std::operator+(&helpMessage,&local_50,directory);
  ::std::__cxx11::string::~string((string *)&local_50);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this,(string *)&helpMessage);
  __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void SystemUtils::makeDirectoryForNonWindows(const std::string& directory)
    {
        APPROVAL_TESTS_UNUSED(directory);
#ifndef _WIN32
        mode_t nMode = 0733; // UNIX style permissions
        int nError = mkdir(directory.c_str(), nMode);
        if (nError != 0)
        {
            std::string helpMessage =
                std::string("Unable to create directory: ") + directory;
            throw std::runtime_error(helpMessage);
        }
#endif
    }